

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O0

void __thiscall
DenseHashMapMoveTest_MoveAssignment_Test::TestBody(DenseHashMapMoveTest_MoveAssignment_Test *this)

{
  bool bVar1;
  size_type sVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  h2;
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  h;
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  *in_stack_fffffffffffffd88;
  allocator_type *in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  hasher *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  int line;
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  *in_stack_fffffffffffffdb0;
  Type in_stack_fffffffffffffdbc;
  Type type;
  AssertHelper *in_stack_fffffffffffffdc0;
  Message *in_stack_fffffffffffffe08;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe10;
  AssertionResult local_1d0 [2];
  undefined4 local_1ac;
  AssertionResult local_1a8 [2];
  undefined4 local_184;
  AssertionResult local_180;
  uint local_16c;
  undefined4 local_158;
  undefined4 local_154;
  AssertionResult local_150 [3];
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  libc_allocator_with_realloc<std::pair<const_int,_A>_> local_c3 [104];
  libc_allocator_with_realloc<std::pair<const_int,_A>_> local_5b [91];
  
  google::libc_allocator_with_realloc<std::pair<const_int,_A>_>::libc_allocator_with_realloc
            (local_5b);
  google::
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::dense_hash_map(in_stack_fffffffffffffdb0,
                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                   in_stack_fffffffffffffda0,
                   (key_equal *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                   in_stack_fffffffffffffd90);
  google::libc_allocator_with_realloc<std::pair<const_int,_A>_>::~libc_allocator_with_realloc
            (local_5b);
  google::libc_allocator_with_realloc<std::pair<const_int,_A>_>::libc_allocator_with_realloc
            (local_c3);
  google::
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::dense_hash_map(in_stack_fffffffffffffdb0,
                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                   in_stack_fffffffffffffda0,
                   (key_equal *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                   in_stack_fffffffffffffd90);
  google::libc_allocator_with_realloc<std::pair<const_int,_A>_>::~libc_allocator_with_realloc
            (local_c3);
  local_c8 = 0;
  google::
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::set_empty_key((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                   *)in_stack_fffffffffffffd90,(key_type *)in_stack_fffffffffffffd88);
  local_cc = 1;
  local_d0 = 2;
  google::
  dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
  ::emplace<int,int>((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                      *)in_stack_fffffffffffffda0,
                     (int *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                     (int *)in_stack_fffffffffffffd90);
  local_f4 = 2;
  local_f8 = 3;
  google::
  dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
  ::emplace<int,int>((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                      *)in_stack_fffffffffffffda0,
                     (int *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                     (int *)in_stack_fffffffffffffd90);
  local_11c = 3;
  local_120 = 4;
  google::
  dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
  ::emplace<int,int>((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                      *)in_stack_fffffffffffffda0,
                     (int *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                     (int *)in_stack_fffffffffffffd90);
  A::reset();
  google::
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::operator=((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
               *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  local_154 = 3;
  sVar2 = google::
          dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
          ::size((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                  *)0x10794dd);
  local_158 = (undefined4)sVar2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             (char *)in_stack_fffffffffffffda0,
             (int *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
             (int *)in_stack_fffffffffffffd90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_150);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10795f5);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,(char *)in_stack_fffffffffffffdb0
               ,in_stack_fffffffffffffdac,(char *)in_stack_fffffffffffffda0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffe10._M_head_impl,in_stack_fffffffffffffe08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd90);
    testing::Message::~Message((Message *)0x1079652);
  }
  local_16c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10796c0);
  if (local_16c == 0) {
    local_184 = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
               (char *)in_stack_fffffffffffffda0,
               (int *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
               (int *)in_stack_fffffffffffffd90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
      in_stack_fffffffffffffdc0 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1079771);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                 (char *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,
                 (char *)in_stack_fffffffffffffda0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffe10._M_head_impl,in_stack_fffffffffffffe08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd90);
      testing::Message::~Message((Message *)0x10797ce);
    }
    local_16c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x107983c);
    if (local_16c == 0) {
      local_1ac = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                 (char *)in_stack_fffffffffffffda0,
                 (int *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                 (int *)in_stack_fffffffffffffd90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1a8);
      type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdbc);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
        in_stack_fffffffffffffdb0 =
             (dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
              *)testing::AssertionResult::failure_message((AssertionResult *)0x10798ed);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffdc0,type,(char *)in_stack_fffffffffffffdb0,
                   in_stack_fffffffffffffdac,(char *)in_stack_fffffffffffffda0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffe10._M_head_impl,in_stack_fffffffffffffe08)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd90);
        testing::Message::~Message((Message *)0x107994a);
      }
      local_16c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10799b8);
      if (local_16c == 0) {
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                   (char *)in_stack_fffffffffffffda0,
                   (int *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                   (int *)in_stack_fffffffffffffd90);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d0);
        line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdac);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
          in_stack_fffffffffffffda0 =
               (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0x1079a69);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffdc0,type,(char *)in_stack_fffffffffffffdb0,line,
                     (char *)in_stack_fffffffffffffda0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)in_stack_fffffffffffffe10._M_head_impl,
                     in_stack_fffffffffffffe08);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd90);
          testing::Message::~Message((Message *)0x1079ac6);
        }
        local_16c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1079b31);
        if (local_16c == 0) {
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((char *)CONCAT44(line,in_stack_fffffffffffffda8),
                     (char *)in_stack_fffffffffffffda0,
                     (int *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                     (int *)in_stack_fffffffffffffd90);
          bVar1 = testing::AssertionResult::operator_cast_to_bool
                            ((AssertionResult *)&stack0xfffffffffffffe08);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
            this_00 = (AssertHelper *)
                      testing::AssertionResult::failure_message((AssertionResult *)0x1079bd9);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffdc0,type,(char *)in_stack_fffffffffffffdb0,line,
                       (char *)in_stack_fffffffffffffda0);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)in_stack_fffffffffffffe10._M_head_impl,
                       in_stack_fffffffffffffe08);
            testing::internal::AssertHelper::~AssertHelper(this_00);
            testing::Message::~Message((Message *)0x1079c27);
          }
          local_16c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1079c8c);
          if (local_16c == 0) {
            local_16c = 0;
          }
        }
      }
    }
  }
  google::
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::~dense_hash_map((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                     *)0x1079cb1);
  google::
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::~dense_hash_map((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                     *)0x1079cbe);
  return;
}

Assistant:

TEST(DenseHashMapMoveTest, MoveAssignment)
{
    dense_hash_map<int, A> h(10), h2;
    h.set_empty_key(0);

    h.emplace(1, 2);
    h.emplace(2, 3);
    h.emplace(3, 4);
    A::reset();

    h2 = std::move(h);

    ASSERT_EQ(3, (int)h2.size());

    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(0, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);
}